

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::NeuralNetworkClassifier::InternalSwap
          (NeuralNetworkClassifier *this,NeuralNetworkClassifier *other)

{
  NeuralNetworkClassifier *other_local;
  NeuralNetworkClassifier *this_local;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->layers_).super_RepeatedPtrFieldBase,
             &(other->layers_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->preprocessing_).super_RepeatedPtrFieldBase,
             &(other->preprocessing_).super_RepeatedPtrFieldBase);
  std::swap<std::__cxx11::string*>
            (&(this->labelprobabilitylayername_).ptr_,&(other->labelprobabilitylayername_).ptr_);
  std::swap<CoreML::Specification::NetworkUpdateParameters*>
            (&this->updateparams_,&other->updateparams_);
  std::swap<int>(&this->arrayinputshapemapping_,&other->arrayinputshapemapping_);
  std::swap<int>(&this->imageinputshapemapping_,&other->imageinputshapemapping_);
  std::swap<CoreML::Specification::NeuralNetworkClassifier::ClassLabelsUnion>
            (&this->ClassLabels_,&other->ClassLabels_);
  std::swap<unsigned_int>(this->_oneof_case_,other->_oneof_case_);
  std::swap<int>(&this->_cached_size_,&other->_cached_size_);
  return;
}

Assistant:

void NeuralNetworkClassifier::InternalSwap(NeuralNetworkClassifier* other) {
  layers_.InternalSwap(&other->layers_);
  preprocessing_.InternalSwap(&other->preprocessing_);
  labelprobabilitylayername_.Swap(&other->labelprobabilitylayername_);
  std::swap(updateparams_, other->updateparams_);
  std::swap(arrayinputshapemapping_, other->arrayinputshapemapping_);
  std::swap(imageinputshapemapping_, other->imageinputshapemapping_);
  std::swap(ClassLabels_, other->ClassLabels_);
  std::swap(_oneof_case_[0], other->_oneof_case_[0]);
  std::swap(_cached_size_, other->_cached_size_);
}